

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O1

shared_ptr<gui::PanelStyle> __thiscall gui::DefaultTheme::makePanelStyle(DefaultTheme *this)

{
  Gui *__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::PanelStyle> sVar1;
  undefined1 local_11;
  
  __args = *(Gui **)(in_RSI + 8);
  (this->super_Theme)._vptr_Theme = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gui::PanelStyle,std::allocator<gui::PanelStyle>,gui::Gui_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Theme).gui_,
             (PanelStyle **)this,(allocator<gui::PanelStyle> *)&local_11,__args);
  PanelStyle::setFillColor
            ((PanelStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorVeryLightGray);
  PanelStyle::setOutlineColor
            ((PanelStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorGray2);
  PanelStyle::setOutlineThickness((PanelStyle *)(this->super_Theme)._vptr_Theme,-2.0);
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::PanelStyle>)
         sVar1.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PanelStyle> DefaultTheme::makePanelStyle() const {
    auto style = std::make_shared<PanelStyle>(gui_);
    style->setFillColor(colorVeryLightGray);
    style->setOutlineColor(colorGray2);
    style->setOutlineThickness(-2.0f);

    return style;
}